

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O3

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t **edges,int edgeCount,int *vertexDegree)

{
  Rpo_LCI_Edge_t RVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (0 < edgeCount) {
    uVar2 = 0xffffffff;
    uVar3 = 0;
    iVar4 = -1;
    uVar8 = 0xffffffff;
    do {
      RVar1 = *edges[uVar3];
      if (((ulong)RVar1 & 1) == 0) {
        uVar7 = (uint)((ulong)RVar1 >> 4);
        uVar9 = (ulong)(uVar7 & 0x3fffffff);
        uVar6 = (ulong)RVar1 >> 0x22;
        uVar7 = vertexDegree[uVar6] + *(int *)((long)vertexDegree + (ulong)(uVar7 << 2));
        if (uVar9 < uVar6) {
          uVar6 = uVar9;
        }
        iVar5 = (int)uVar6;
        if (uVar7 < uVar8) {
          uVar2 = uVar3 & 0xffffffff;
          uVar8 = uVar7;
          iVar4 = iVar5;
        }
        else if (uVar7 == uVar8 && iVar5 < iVar4) {
          uVar2 = uVar3 & 0xffffffff;
          iVar4 = iVar5;
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)edgeCount != uVar3);
    return (int)uVar2;
  }
  return -1;
}

Assistant:

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t** edges, int edgeCount, int* vertexDegree) {
    int minCostIndex = -1;
    int minVertexIndex = -1;
    unsigned int minCost = ~0;
    Rpo_LCI_Edge_t* edge;
    unsigned int edgeCost;
    int minVertex;
    int i;
    for (i = 0; i < edgeCount; ++i) {
        edge = edges[i];
        if (!edge->visited) {
            edgeCost = vertexDegree[edge->idx1] + vertexDegree[edge->idx2];
            minVertex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
            if (edgeCost < minCost) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            } else if ((edgeCost == minCost) && minVertex < minVertexIndex) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            }
        }
    }
    return minCostIndex;
}